

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngineDriver.cpp
# Opt level: O3

int main(void)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  long lVar2;
  GameLoop *pGVar3;
  pointer ppPVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[34m",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------ Running the game start phase --------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  GameLoop::startSingle(true);
  pGVar3 = GameLoop::getInstance();
  if ((pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pGVar3 = GameLoop::getInstance();
      ppPVar4 = (pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar9;
      if ((ulong)((long)(pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3) <= uVar9)
      {
LAB_00108f97:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      uVar8 = 0;
      while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&(ppPVar4[uVar9]->pOwnedCountries->
                                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                            )._M_impl + 8) -
                             *(long *)&(ppPVar4[uVar9]->pOwnedCountries->
                                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                       )._M_impl >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player ",7);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," owns country : ",0x10);
        pGVar3 = GameLoop::getInstance();
        ppPVar4 = (pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar9;
        if (((ulong)((long)(pGVar3->allPlayers->
                           super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3) <= uVar9) ||
           (pvVar1 = ppPVar4[uVar9]->pOwnedCountries,
           lVar2 = *(long *)&(pvVar1->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl, uVar7 = uVar8,
           (ulong)((long)*(pointer *)
                          ((long)&(pvVar1->
                                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                  )._M_impl + 8) - lVar2 >> 3) <= uVar8)) goto LAB_00108f97;
        plVar6 = *(long **)(*(long *)(lVar2 + uVar8 * 8) + 8);
        lVar2 = *plVar6;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,lVar2,plVar6[1] + lVar2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_50,local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        uVar8 = uVar8 + 1;
        pGVar3 = GameLoop::getInstance();
        ppPVar4 = (pGVar3->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar9;
        if ((ulong)((long)(pGVar3->allPlayers->
                          super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3) <= uVar9)
        goto LAB_00108f97;
      }
      uVar9 = uVar9 + 1;
      pGVar3 = GameLoop::getInstance();
    } while (uVar9 < (ulong)((long)(pGVar3->allPlayers->
                                   super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(pGVar3->allPlayers->
                                   super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nprint map to compare with output of start : \n",0x2e);
  pGVar3 = GameLoop::getInstance();
  Map::printMap(pGVar3->gameMap);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n\x1b[34m",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------- Deck ------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of cards in the deck: ",0x1d);
  pGVar3 = GameLoop::getInstance();
  plVar6 = (long *)std::ostream::operator<<(&std::cout,*pGVar3->gameDeck->deckSize);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of countries in the map: ",0x20);
  GameLoop::getInstance();
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n\x1b[34m",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------ Distributing armies -----------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  pGVar3 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nprint map to see where armies went : \n",0x27);
  pGVar3 = GameLoop::getInstance();
  Map::printMap(pGVar3->gameMap);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n\x1b[34m",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------- Running the main game loop -------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  pGVar3 = GameLoop::getInstance();
  GameLoop::loop(pGVar3,200);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running the game start phase --------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "\n";

    GameLoop::startSingle(true);

    for (unsigned long i = 0; i < GameLoop::getInstance()->getAllPlayers()->size(); i++) {
        for (unsigned long j = 0;
             j < GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->size(); j++) {
            cout << "player " << i << " owns country : "
                 << GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->at(j)->getCountryName()
                 << "\n";
        }
    }

    cout << "\nprint map to compare with output of start : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "-------------------------- Deck ------------------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "Number of cards in the deck: " << *GameLoop::getInstance()->getGameDeck()->getNumberOfCards() << endl;
    cout << "Number of countries in the map: " << GameLoop::getInstance()->getGameMap()->getMapCountries()->size()
         << endl;

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------------ Distributing armies -----------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->distributeArmies();

    cout << "\nprint map to see where armies went : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "--------------- Running the main game loop -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->loop(200);
    GameLoop::resetInstance();
    return 0;
}